

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O3

void __thiscall
Omega_h::InputYamlReader::handle_block_scalar
          (InputYamlReader *this,size_t parent_indent_level,string *header,
          string *leading_empties_or_comments,string *rest,string *content,string *comment)

{
  ulong uVar1;
  size_type *psVar2;
  pointer pcVar3;
  string *psVar4;
  istream *piVar5;
  long lVar6;
  size_type sVar7;
  ulong uVar8;
  ParserFail *this_00;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  undefined8 *puVar12;
  char *pcVar13;
  ulong uVar14;
  undefined8 uVar15;
  ulong uVar16;
  string msg;
  string newline;
  size_t indentation_indicator;
  stringstream ss;
  char local_24a;
  char local_249;
  string local_248;
  string local_228;
  undefined1 *local_208;
  long local_200;
  undefined1 local_1f8;
  undefined7 uStack_1f7;
  ulong local_1e8;
  ulong *local_1e0;
  long local_1d8;
  ulong local_1d0 [2];
  string *local_1c0;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  local_1e8 = 0;
  local_249 = *(header->_M_dataplus)._M_p;
  std::__cxx11::string::substr((ulong)&local_208,(ulong)header);
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_208,_S_out|_S_in);
  if (local_208 != &local_1f8) {
    operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
  }
  if ((1 < header->_M_string_length) && ((byte)(header->_M_dataplus)._M_p[1] - 0x30 < 10)) {
    std::istream::_M_extract<unsigned_long>((ulong *)local_1b8);
    local_1e8 = local_1e8 + parent_indent_level;
  }
  piVar5 = std::operator>>((istream *)local_1b8,&local_24a);
  if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
    local_24a = '\0';
  }
  lVar6 = std::__cxx11::string::find_first_of((char *)leading_empties_or_comments,0x449c4c,0);
  local_208 = &local_1f8;
  local_200 = 0;
  local_1f8 = 0;
  if (lVar6 == 0) {
    pcVar13 = "\n";
  }
  else {
    pcVar13 = "\n";
    if ((leading_empties_or_comments->_M_dataplus)._M_p[lVar6 + -1] == '\r') {
      pcVar13 = "\r\n";
    }
  }
  std::__cxx11::string::_M_replace((ulong)&local_208,0,(char *)0x0,(ulong)pcVar13);
  if (*(leading_empties_or_comments->_M_dataplus)._M_p == '#') {
    std::__cxx11::string::substr((ulong)&local_248,(ulong)leading_empties_or_comments);
    std::__cxx11::string::operator=((string *)comment,(string *)&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
  }
  local_1c0 = rest;
  sVar7 = std::__cxx11::string::find_first_not_of((char *)leading_empties_or_comments,0x449c4f,0);
  if (sVar7 == 0xffffffffffffffff) {
    sVar7 = leading_empties_or_comments->_M_string_length;
  }
  uVar8 = std::__cxx11::string::rfind((char *)leading_empties_or_comments,0x44866e,sVar7);
  uVar16 = ~uVar8 + sVar7;
  uVar8 = uVar16;
  if ((local_1e8 != 0) && (uVar8 = local_1e8, uVar16 < local_1e8)) {
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_248,"Indentation indicator ","");
    std::__cxx11::to_string(&local_228,local_1e8);
    std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_228._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_248);
    std::__cxx11::to_string(&local_228,uVar16);
    std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_228._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_248);
    this_00 = (ParserFail *)__cxa_allocate_exception(0x10);
    ParserFail::ParserFail(this_00,&local_248);
    __cxa_throw(this_00,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::substr((ulong)&local_248,(ulong)leading_empties_or_comments);
  std::__cxx11::string::operator=((string *)content,(string *)&local_248);
  psVar4 = local_1c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_append((char *)content,(ulong)(psVar4->_M_dataplus)._M_p);
  uVar16 = std::__cxx11::string::find_last_of
                     ((char *)content,0x44866e,content->_M_string_length - 2);
  while (uVar16 != 0xffffffffffffffff) {
    uVar1 = uVar16 + 1;
    if (uVar1 < content->_M_string_length) {
      uVar14 = content->_M_string_length + ~uVar16;
      uVar9 = 0;
      do {
        uVar10 = uVar9;
        if ((content->_M_dataplus)._M_p[uVar9 + uVar16 + 1] != ' ') break;
        uVar9 = uVar9 + 1;
        uVar10 = uVar14;
      } while (uVar14 != uVar9);
    }
    else {
      uVar10 = 0;
    }
    if (uVar8 <= uVar10) break;
    pcVar3 = (content->_M_dataplus)._M_p;
    content->_M_string_length = uVar1;
    pcVar3[uVar1] = '\0';
    uVar16 = std::__cxx11::string::find_last_of
                       ((char *)content,0x44866e,content->_M_string_length - 2);
  }
  lVar6 = std::__cxx11::string::find_first_of((char *)content,0x44866e,0);
  if (lVar6 != -1) {
    do {
      lVar11 = local_200;
      if (local_249 != '>') {
        lVar11 = 0;
      }
      uVar8 = lVar6 + 1;
      if (uVar8 < content->_M_string_length) {
        uVar16 = uVar8;
        do {
          if ((content->_M_dataplus)._M_p[uVar16] != ' ') break;
          uVar16 = uVar16 + 1;
        } while (content->_M_string_length != uVar16);
      }
      std::__cxx11::string::substr((ulong)&local_228,(ulong)content);
      std::__cxx11::string::substr((ulong)&local_1e0,(ulong)content);
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        uVar15 = local_228.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_1d8 + local_228._M_string_length) {
        uVar16 = 0xf;
        if (local_1e0 != local_1d0) {
          uVar16 = local_1d0[0];
        }
        if (uVar16 < local_1d8 + local_228._M_string_length) goto LAB_002eeef7;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_1e0,0,(char *)0x0,(ulong)local_228._M_dataplus._M_p);
      }
      else {
LAB_002eeef7:
        puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_1e0)
        ;
      }
      psVar2 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar2) {
        local_248.field_2._M_allocated_capacity = *psVar2;
        local_248.field_2._8_8_ = puVar12[3];
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      }
      else {
        local_248.field_2._M_allocated_capacity = *psVar2;
        local_248._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_248._M_string_length = puVar12[1];
      *puVar12 = psVar2;
      puVar12[1] = 0;
      *(undefined1 *)psVar2 = 0;
      std::__cxx11::string::operator=((string *)content,(string *)&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if (local_1e0 != local_1d0) {
        operator_delete(local_1e0,local_1d0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      lVar6 = std::__cxx11::string::find_first_of((char *)content,0x44866e,uVar8 - lVar11);
    } while (lVar6 != -1);
  }
  if (local_24a != '+') {
    sVar7 = content->_M_string_length;
    if (sVar7 != 0) {
      do {
        uVar8 = (ulong)(byte)(content->_M_dataplus)._M_p[sVar7 - 1];
        if ((0x20 < uVar8) || ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0)) break;
        sVar7 = sVar7 - 1;
      } while (sVar7 != 0);
    }
    std::__cxx11::string::substr((ulong)&local_248,(ulong)content);
    std::__cxx11::string::operator=((string *)content,(string *)&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if (local_24a != '-') {
      std::__cxx11::string::_M_append((char *)content,(ulong)local_208);
    }
  }
  if (local_249 == '|') {
    std::__cxx11::string::substr((ulong)&local_248,(ulong)content);
    std::__cxx11::string::operator=((string *)content,(string *)&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void handle_block_scalar(std::size_t parent_indent_level,
      std::string const& header, std::string const& leading_empties_or_comments,
      std::string const& rest, std::string& content, std::string& comment) {
    /* read the header, resulting in: block style, chomping indicator, and
     * indentation indicator */
    char style;
    char chomping_indicator;
    std::size_t indentation_indicator = 0;
    style = header[0];
    std::stringstream ss(header.substr(1, std::string::npos));
    if (header.size() > 1 && my_isdigit(header[1])) {
      ss >> indentation_indicator;
      // indentation indicator is given as a relative number, but we need it in
      // absolute terms
      indentation_indicator += parent_indent_level;
    }
    if (!(ss >> chomping_indicator)) chomping_indicator = '\0';
    /* get information about newlines, indentation level, and comment from
       the leading_empties_or_comments string */
    std::size_t first_newline =
        leading_empties_or_comments.find_first_of("\r\n");
    std::string newline;
    if (first_newline > 0 &&
        leading_empties_or_comments[first_newline - 1] == '\r') {
      newline = "\r\n";
    } else {
      newline = "\n";
    }
    std::size_t keep_beg = first_newline + 1 - newline.size();
    if (leading_empties_or_comments[0] == '#') {
      comment = leading_empties_or_comments.substr(1, keep_beg);
    }
    // according to the YAML spec, a tab is content, not indentation
    std::size_t content_beg =
        leading_empties_or_comments.find_first_not_of("\r\n ");
    if (content_beg == std::string::npos)
      content_beg = leading_empties_or_comments.size();
    std::size_t newline_before_content =
        leading_empties_or_comments.rfind("\n", content_beg);
    std::size_t num_indent_spaces = (content_beg - newline_before_content) - 1;
    /* indentation indicator overrides the derived level of indentation, in case
       the
       user wants to keep some of that indentation as content */
    if (indentation_indicator > 0) {
      if (num_indent_spaces < indentation_indicator) {
        std::string msg = "Indentation indicator ";
        msg += std::to_string(indentation_indicator);
        msg += " > leading spaces ";
        msg += std::to_string(num_indent_spaces);
        msg += "\n";
        throw ParserFail(msg);
      }
      num_indent_spaces = indentation_indicator;
    }
    /* prepend the content from the leading_empties_or_comments to the rest */
    content = leading_empties_or_comments.substr(keep_beg, std::string::npos);
    content += rest;
    /* per Trilinos issue #2090, there can be trailing comments after the block
       scalar which are less indented than it, but they will be included in the
       final NEWLINE token.
       this code removes all contiguous trailing lines which are less indented
       than the content.
     */
    while (true) {
      auto last_newline = content.find_last_of("\n", content.size() - 2);
      if (last_newline == std::string::npos) break;
      std::size_t num_spaces = 0;
      for (auto ispace = last_newline + 1;
           ispace < content.size() && content[ispace] == ' '; ++ispace) {
        ++num_spaces;
      }
      if (num_spaces >= num_indent_spaces) break;
      content.erase(content.begin() + long(last_newline + 1), content.end());
    }
    /* remove both indentation and newlines as dictated by header information */
    std::size_t unindent_pos = 0;
    while (true) {
      std::size_t next_newline = content.find_first_of("\n", unindent_pos);
      if (next_newline == std::string::npos) break;
      std::size_t start_cut = next_newline + 1;
      /* folding block scalars remove newlines */
      if (style == '>') start_cut -= newline.size();
      std::size_t end_cut = next_newline + 1;
      /* the actual amount of indentation in the content varies, start by
         marking it all for removal */
      while (end_cut < content.size() && content[end_cut] == ' ') {
        ++end_cut;
      }
      /* but don't remove more than the actual indent number */
      end_cut = std::min(next_newline + 1 + num_indent_spaces, end_cut);
      /* cut this (newline?)+indentation out of the content */
      content = content.substr(0, start_cut) +
                content.substr(end_cut, std::string::npos);
      unindent_pos = start_cut;
    }
    if (chomping_indicator != '+') {
      content = remove_trailing_whitespace_and_newlines(content);
      if (chomping_indicator != '-') content += newline;
    }
    if (style == '|') {
      // if not already, remove the leading newline
      content = content.substr(newline.size(), std::string::npos);
    }
  }